

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O2

int ABC_AddTarget(ABC_Manager mng,int nog,char **names,int *values)

{
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *pVVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  void **ppvVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  char *__format;
  ulong uVar10;
  Abc_Obj_t *pObj;
  
  if (nog < 1) {
    puts("ABC_AddTarget: The target has no gates.");
    iVar4 = 0;
  }
  else {
    mng->nog = 0;
    mng->vNodes->nSize = 0;
    mng->vValues->nSize = 0;
    for (uVar10 = 0; (uint)nog != uVar10; uVar10 = uVar10 + 1) {
      iVar4 = stmm_lookup(mng->tName2Node,names[uVar10],(char **)&pObj);
      pAVar3 = pObj;
      if (iVar4 == 0) {
        pcVar9 = names[uVar10];
        __format = "ABC_AddTarget: The target gate \"%s\" is not in the network.\n";
LAB_0043ba4b:
        printf(__format,pcVar9);
        return 0;
      }
      pVVar1 = mng->vNodes;
      iVar4 = pVVar1->nSize;
      if (iVar4 == pVVar1->nCap) {
        uVar7 = iVar4 * 2;
        if (iVar4 < 0x10) {
          uVar7 = 0x10;
        }
        if (iVar4 < (int)uVar7) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar7 << 3);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar1->pArray,(ulong)uVar7 << 3);
            iVar4 = pVVar1->nSize;
          }
          pVVar1->pArray = ppvVar5;
          pVVar1->nCap = uVar7;
        }
      }
      pVVar1->nSize = iVar4 + 1;
      pVVar1->pArray[iVar4] = pAVar3;
      uVar7 = values[uVar10];
      if (1 < uVar7) {
        pcVar9 = names[uVar10];
        __format = "ABC_AddTarget: The value of gate \"%s\" is not 0 or 1.\n";
        goto LAB_0043ba4b;
      }
      pVVar2 = mng->vValues;
      iVar4 = pVVar2->nSize;
      if (iVar4 == pVVar2->nCap) {
        uVar8 = iVar4 * 2;
        if (iVar4 < 0x10) {
          uVar8 = 0x10;
        }
        if (iVar4 < (int)uVar8) {
          if (pVVar2->pArray == (int *)0x0) {
            piVar6 = (int *)malloc((ulong)uVar8 << 2);
          }
          else {
            piVar6 = (int *)realloc(pVVar2->pArray,(ulong)uVar8 << 2);
          }
          pVVar2->pArray = piVar6;
          if (piVar6 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar2->nCap = uVar8;
          iVar4 = pVVar2->nSize;
        }
      }
      pVVar2->nSize = iVar4 + 1;
      pVVar2->pArray[iVar4] = uVar7;
    }
    mng->nog = nog;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int ABC_AddTarget( ABC_Manager mng, int nog, char ** names, int * values )
{
    Abc_Obj_t * pObj;
    int i;
    if ( nog < 1 )
        { printf( "ABC_AddTarget: The target has no gates.\n" ); return 0; }
    // clear storage for the target
    mng->nog = 0;
    Vec_PtrClear( mng->vNodes );
    Vec_IntClear( mng->vValues );
    // save the target
    for ( i = 0; i < nog; i++ )
    {
        if ( !stmm_lookup( mng->tName2Node, names[i], (char **)&pObj ) )
            { printf( "ABC_AddTarget: The target gate \"%s\" is not in the network.\n", names[i] ); return 0; }
        Vec_PtrPush( mng->vNodes, pObj );
        if ( values[i] < 0 || values[i] > 1 )
            { printf( "ABC_AddTarget: The value of gate \"%s\" is not 0 or 1.\n", names[i] ); return 0; }
        Vec_IntPush( mng->vValues, values[i] );
    }
    mng->nog = nog;
    return 1;
}